

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void __thiscall
Fixpp::impl::
FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<605u,Fixpp::Type::String>,Fixpp::TagT<606u,Fixpp::Type::String>>>>
::
parse<Fixpp::impl::TagSet<Fixpp::ComponentBlock<Fixpp::TagT<600u,Fixpp::Type::String>,Fixpp::TagT<601u,Fixpp::Type::String>,Fixpp::TagT<602u,Fixpp::Type::String>,Fixpp::TagT<603u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<604u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<605u,Fixpp::Type::String>,Fixpp::TagT<606u,Fixpp::Type::String>>,Fixpp::TagT<607u,Fixpp::Type::Int>,Fixpp::TagT<608u,Fixpp::Type::String>,Fixpp::TagT<609u,Fixpp::Type::String>,Fixpp::TagT<764u,Fixpp::Type::String>,Fixpp::TagT<610u,Fixpp::Type::String>,Fixpp::TagT<611u,Fixpp::Type::String>,Fixpp::TagT<248u,Fixpp::Type::String>,Fixpp::TagT<249u,Fixpp::Type::String>,Fixpp::TagT<250u,Fixpp::Type::Int>,Fixpp::TagT<251u,Fixpp::Type::Int>,Fixpp::TagT<252u,Fixpp::Type::Float>,Fixpp::TagT<253u,Fixpp::Type::Float>,Fixpp::TagT<257u,Fixpp::Type::String>,Fixpp::TagT<599u,Fixpp::Type::String>,Fixpp::TagT<596u,Fixpp::Type::String>,Fixpp::TagT<597u,Fixpp::Type::String>,Fixpp::TagT<598u,Fixpp::Type::String>,Fixpp::TagT<254u,Fixpp::Type::String>,Fixpp::TagT<612u,Fixpp::Type::Float>,Fixpp::TagT<942u,Fixpp::Type::String>,Fixpp::TagT<613u,Fixpp::Type::Char>,Fixpp::TagT<614u,Fixpp::Type::Float>,Fixpp::TagT<615u,Fixpp::Type::Float>,Fixpp::TagT<616u,Fixpp::Type::String>,Fixpp::TagT<617u,Fixpp::Type::String>,Fixpp::TagT<618u,Fixpp::Type::Int>,Fixpp::TagT<619u,Fixpp::Type::Data>,Fixpp::TagT<620u,Fixpp::Type::String>,Fixpp::TagT<621u,Fixpp::Type::Int>,Fixpp::TagT<622u,Fixpp::Type::Data>,Fixpp::TagT<623u,Fixpp::Type::Float>,Fixpp::TagT<624u,Fixpp::Type::Char>,Fixpp::TagT<556u,Fixpp::Type::String>,Fixpp::TagT<740u,Fixpp::Type::String>,Fixpp::TagT<739u,Fixpp::Type::String>,Fixpp::TagT<955u,Fixpp::Type::String>,Fixpp::TagT<956u,Fixpp::Type::String>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<605u,Fixpp::Type::String>,Fixpp::TagT<606u,Fixpp::Type::String>>>>
           *this,Field *field,ParsingContext *context,
          TagSet<Fixpp::ComponentBlock<Fixpp::TagT<600U,_Fixpp::Type::String>,_Fixpp::TagT<601U,_Fixpp::Type::String>,_Fixpp::TagT<602U,_Fixpp::Type::String>,_Fixpp::TagT<603U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>,_Fixpp::TagT<607U,_Fixpp::Type::Int>,_Fixpp::TagT<608U,_Fixpp::Type::String>,_Fixpp::TagT<609U,_Fixpp::Type::String>,_Fixpp::TagT<764U,_Fixpp::Type::String>,_Fixpp::TagT<610U,_Fixpp::Type::String>,_Fixpp::TagT<611U,_Fixpp::Type::String>,_Fixpp::TagT<248U,_Fixpp::Type::String>,_Fixpp::TagT<249U,_Fixpp::Type::String>,_Fixpp::TagT<250U,_Fixpp::Type::Int>,_Fixpp::TagT<251U,_Fixpp::Type::Int>,_Fixpp::TagT<252U,_Fixpp::Type::Float>,_Fixpp::TagT<253U,_Fixpp::Type::Float>,_Fixpp::TagT<257U,_Fixpp::Type::String>,_Fixpp::TagT<599U,_Fixpp::Type::String>,_Fixpp::TagT<596U,_Fixpp::Type::String>,_Fixpp::TagT<597U,_Fixpp::Type::String>,_Fixpp::TagT<598U,_Fixpp::Type::String>,_Fixpp::TagT<254U,_Fixpp::Type::String>,_Fixpp::TagT<612U,_Fixpp::Type::Float>,_Fixpp::TagT<942U,_Fixpp::Type::String>,_Fixpp::TagT<613U,_Fixpp::Type::Char>,_Fixpp::TagT<614U,_Fixpp::Type::Float>,_Fixpp::TagT<615U,_Fixpp::Type::Float>,_Fixpp::TagT<616U,_Fixpp::Type::String>,_Fixpp::TagT<617U,_Fixpp::Type::String>,_Fixpp::TagT<618U,_Fixpp::Type::Int>,_Fixpp::TagT<619U,_Fixpp::Type::Data>,_Fixpp::TagT<620U,_Fixpp::Type::String>,_Fixpp::TagT<621U,_Fixpp::Type::Int>,_Fixpp::TagT<622U,_Fixpp::Type::Data>,_Fixpp::TagT<623U,_Fixpp::Type::Float>,_Fixpp::TagT<624U,_Fixpp::Type::Char>,_Fixpp::TagT<556U,_Fixpp::Type::String>,_Fixpp::TagT<740U,_Fixpp::Type::String>,_Fixpp::TagT<739U,_Fixpp::Type::String>,_Fixpp::TagT<955U,_Fixpp::Type::String>,_Fixpp::TagT<956U,_Fixpp::Type::String>_>_>
          *tagSet,bool strict,bool skipUnknown)

{
  StreamCursor *cursor;
  StreamBuf<char> *pSVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  char cVar5;
  int64_t iVar6;
  int64_t iVar7;
  char *pcVar8;
  Type type;
  ulong uVar9;
  undefined1 auStack_228 [8];
  GroupType groupRef;
  undefined1 auStack_e8 [8];
  GroupSet groupSet;
  Revert local_90;
  undefined1 local_68 [8];
  Visitor visitor;
  int local_38;
  uint local_34;
  int instances;
  int tag;
  
  cursor = context->cursor;
  visitor._24_8_ = field;
  bVar4 = match_int_fast(&local_38,cursor);
  iVar3 = local_38;
  if (bVar4) {
    bVar4 = StreamCursor::advance(cursor,1);
    if (iVar3 == 0) {
      if (bVar4) {
        return;
      }
      pcVar8 = "Got early EOF after tag %d value";
    }
    else {
      if (bVar4) {
        llvm::
        SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>_>
        ::reserve((SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>_>
                   *)visitor._24_8_,(long)local_38);
        groupSet.bits.super__Base_bitset<10UL>._M_w[7] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[8] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[5] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[6] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[3] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[4] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[1] = 0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[2] = 0;
        auStack_e8 = (undefined1  [8])0x0;
        groupSet.bits.super__Base_bitset<10UL>._M_w[0] = 0;
LAB_00a9575e:
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
        .unparsed.
        super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
        .
        super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
        .
        super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
        .super_SmallVectorBase.EndX =
             (void *)((long)groupRef.
                            super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                            .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer
                     + 0x10);
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
        .allBits.super__Base_bitset<1UL>._M_w =
             (_Base_bitset<1UL>)
             ((long)&groupRef.
                     super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                     .unparsed.
                     super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
                     .
                     super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
                     .
                     super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
                     .super_SmallVectorBase + 0x10);
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
        .values.base.
        super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<605U,_Fixpp::Type::String>_>,_false>.
        value.m_view.second = 0;
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
        .values.base.
        super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<606U,_Fixpp::Type::String>_>,_false>.
        value.m_view.first = (char *)0x0;
        auStack_228 = (undefined1  [8])0x0;
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
        .values.base.
        super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<605U,_Fixpp::Type::String>_>,_false>.
        value.m_view.first = (char *)0x0;
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
        ._32_8_ = 0;
        groupRef.
        super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
        .unparsed.
        super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
        .
        super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_false>
        .
        super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed,_void>
        .super_SmallVectorBase.BeginX =
             (void *)groupRef.
                     super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                     .allBits.super__Base_bitset<1UL>._M_w;
LAB_00a95789:
        while( true ) {
          pSVar1 = cursor->buf;
          local_90.eback = *(char **)&pSVar1->field_0x8;
          local_90.gptr = *(char **)&pSVar1->field_0x10;
          local_90.egptr = *(char **)&pSVar1->field_0x18;
          local_90.active = true;
          local_90.cursor = cursor;
          bVar4 = match_int_fast((int *)&local_34,cursor);
          if (!bVar4) {
            bVar4 = StreamCursor::eof(cursor);
            cVar5 = '?';
            if (!bVar4) {
              cVar5 = StreamCursor::current(cursor);
            }
            ParsingContext::setError
                      (context,ParsingError,
                       "Could not parse tag in RepeatingGroup %d, expected int, got \'%c\'",0x25c,
                       (ulong)(uint)(int)cVar5);
            goto LAB_00a95aad;
          }
          iVar6 = details::
                  IndexesImpl<meta::pack::Pack<Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>
                  ::of_binary_search(local_34);
          if (iVar6 == -1) break;
          bVar4 = std::bitset<607UL>::test((bitset<607UL> *)auStack_e8,(ulong)local_34);
          if (bVar4) goto LAB_00a95920;
          local_90.active = false;
          bVar4 = StreamCursor::advance(cursor,1);
          if (!bVar4) {
            pcVar8 = "Expected value after Tag %d, got EOF";
            goto LAB_00a95a42;
          }
          TagSet<Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::
          set((TagSet<Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
               *)auStack_e8,local_34);
          local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffffffffff00);
          visitor.context = (ParsingContext *)auStack_e8;
          visitor._0_8_ = context;
          visitor.groupSet._0_1_ = strict;
          visitor.groupSet._1_1_ = skipUnknown;
          doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<605u,Fixpp::Type::String>,Fixpp::TagT<606u,Fixpp::Type::String>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<605u,Fixpp::Type::String>,Fixpp::TagT<606u,Fixpp::Type::String>>>>::Visitor,0ul,1ul>
                    (auStack_228,local_34,local_68);
          if ((local_68[0] == '\0') && (bVar4 = StreamCursor::advance(cursor,1), !bVar4)) {
            ParsingContext::setError(context,Incomplete,"Got early EOF in RepeatingGroup %d",0x25c);
            goto LAB_00a95aad;
          }
          StreamCursor::Revert::~Revert(&local_90);
        }
        iVar7 = details::
                IndexesImpl<meta::pack::Pack<Fixpp::TagT<600U,_Fixpp::Type::String>,_Fixpp::TagT<601U,_Fixpp::Type::String>,_Fixpp::TagT<602U,_Fixpp::Type::String>,_Fixpp::TagT<603U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>,_Fixpp::TagT<607U,_Fixpp::Type::Int>,_Fixpp::TagT<608U,_Fixpp::Type::String>,_Fixpp::TagT<609U,_Fixpp::Type::String>,_Fixpp::TagT<764U,_Fixpp::Type::String>,_Fixpp::TagT<610U,_Fixpp::Type::String>,_Fixpp::TagT<611U,_Fixpp::Type::String>,_Fixpp::TagT<248U,_Fixpp::Type::String>,_Fixpp::TagT<249U,_Fixpp::Type::String>,_Fixpp::TagT<250U,_Fixpp::Type::Int>,_Fixpp::TagT<251U,_Fixpp::Type::Int>,_Fixpp::TagT<252U,_Fixpp::Type::Float>,_Fixpp::TagT<253U,_Fixpp::Type::Float>,_Fixpp::TagT<257U,_Fixpp::Type::String>,_Fixpp::TagT<599U,_Fixpp::Type::String>,_Fixpp::TagT<596U,_Fixpp::Type::String>,_Fixpp::TagT<597U,_Fixpp::Type::String>,_Fixpp::TagT<598U,_Fixpp::Type::String>,_Fixpp::TagT<254U,_Fixpp::Type::String>,_Fixpp::TagT<612U,_Fixpp::Type::Float>,_Fixpp::TagT<942U,_Fixpp::Type::String>,_Fixpp::TagT<613U,_Fixpp::Type::Char>,_Fixpp::TagT<614U,_Fixpp::Type::Float>,_Fixpp::TagT<615U,_Fixpp::Type::Float>,_Fixpp::TagT<616U,_Fixpp::Type::String>,_Fixpp::TagT<617U,_Fixpp::Type::String>,_Fixpp::TagT<618U,_Fixpp::Type::Int>,_Fixpp::TagT<619U,_Fixpp::Type::Data>,_Fixpp::TagT<620U,_Fixpp::Type::String>,_Fixpp::TagT<621U,_Fixpp::Type::Int>,_Fixpp::TagT<622U,_Fixpp::Type::Data>,_Fixpp::TagT<623U,_Fixpp::Type::Float>,_Fixpp::TagT<624U,_Fixpp::Type::Char>,_Fixpp::TagT<556U,_Fixpp::Type::String>,_Fixpp::TagT<740U,_Fixpp::Type::String>,_Fixpp::TagT<739U,_Fixpp::Type::String>,_Fixpp::TagT<955U,_Fixpp::Type::String>,_Fixpp::TagT<956U,_Fixpp::Type::String>_>_>
                ::of_binary_search(local_34);
        if ((iVar7 != -1) || (local_34 == 10)) goto LAB_00a95920;
        local_90.active = false;
        bVar4 = StreamCursor::advance(cursor,1);
        if (!bVar4) {
          pcVar8 = "Expected value after tag %d, got EOF";
LAB_00a95a42:
          ParsingContext::setError(context,Incomplete,pcVar8,(ulong)local_34);
LAB_00a95aad:
          StreamCursor::Revert::~Revert(&local_90);
          llvm::
          SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
          ::~SmallVectorImpl((SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
                              *)&groupRef.
                                 super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                                 .allBits);
          return;
        }
        lVar2 = *(long *)&cursor->buf->field_0x8;
        pcVar8 = *(char **)&cursor->buf->field_0x10;
        bVar4 = match_until_fast('|',cursor);
        if (bVar4) {
          if (strict) {
            ParsingContext::setError
                      (context,UnknownTag,"Encountered unknown tag %d in RepeatingGroup %d",
                       (ulong)local_34,0x25c);
            goto LAB_00a95aad;
          }
          if (!skipUnknown) {
            visitor._0_8_ =
                 (lVar2 + *(long *)&cursor->buf->field_0x10) -
                 (long)(pcVar8 + *(long *)&cursor->buf->field_0x8);
            local_68 = (undefined1  [8])pcVar8;
            llvm::
            SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<605u,Fixpp::Type::String>,Fixpp::TagT<606u,Fixpp::Type::String>>::Unparsed>
            ::emplace_back<int&,std::pair<char_const*,unsigned_long>>
                      ((SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<605u,Fixpp::Type::String>,Fixpp::TagT<606u,Fixpp::Type::String>>::Unparsed>
                        *)&groupRef.
                           super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                           .allBits,(int *)&local_34,(pair<const_char_*,_unsigned_long> *)local_68);
          }
          bVar4 = StreamCursor::advance(cursor,1);
          if (bVar4) {
            StreamCursor::Revert::~Revert(&local_90);
            goto LAB_00a95789;
          }
          type = Incomplete;
          pcVar8 = "Got early EOF after tag %d value";
        }
        else {
          pcVar8 = "Expected value after tag %d, got EOF";
          type = ParsingError;
        }
        ParsingContext::setError(context,type,pcVar8,(ulong)local_34);
        goto LAB_00a95aad;
      }
      pcVar8 = "Expected RepeatingGroup %d, got EOF";
    }
    ParsingContext::setError(context,Incomplete,pcVar8,0x25c);
  }
  else {
    bVar4 = StreamCursor::eof(cursor);
    if (bVar4) {
      uVar9 = 0x3f;
    }
    else {
      cVar5 = StreamCursor::current(cursor);
      uVar9 = (ulong)(uint)(int)cVar5;
    }
    ParsingContext::setError
              (context,ParsingError,
               "Could not parse instances number in RepeatingGroup %d, expected int, got \'%c\'",
               0x25c,uVar9);
  }
  return;
LAB_00a95920:
  StreamCursor::Revert::~Revert(&local_90);
  llvm::
  SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>,_false>
  ::push_back((SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>,_false>
               *)visitor._24_8_,
              (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>
               *)auStack_228);
  groupSet.bits.super__Base_bitset<10UL>._M_w[7] = 0;
  groupSet.bits.super__Base_bitset<10UL>._M_w[8] = 0;
  groupSet.bits.super__Base_bitset<10UL>._M_w[5] = 0;
  groupSet.bits.super__Base_bitset<10UL>._M_w[6] = 0;
  groupSet.bits.super__Base_bitset<10UL>._M_w[3] = 0;
  groupSet.bits.super__Base_bitset<10UL>._M_w[4] = 0;
  groupSet.bits.super__Base_bitset<10UL>._M_w[1] = 0;
  groupSet.bits.super__Base_bitset<10UL>._M_w[2] = 0;
  auStack_e8 = (undefined1  [8])0x0;
  groupSet.bits.super__Base_bitset<10UL>._M_w[0] = 0;
  llvm::
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
  ::~SmallVectorImpl((SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>::Unparsed>
                      *)&groupRef.
                         super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>
                         .allBits);
  if (iVar6 == -1) {
    return;
  }
  goto LAB_00a9575e;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool strict, bool skipUnknown)
            {
                auto& cursor = context.cursor;

                int instances;
                TRY_MATCH_INT(
                    instances,
                    "Could not parse instances number in RepeatingGroup %d, expected int, got '%c'",
                     GroupTag::Id, CURSOR_CURRENT(cursor)
                );

                if (!instances)
                {
                    TRY_ADVANCE("Got early EOF after tag %d value", GroupTag::Id);
                    return;
                }

                // Literal('=')
                TRY_ADVANCE("Expected RepeatingGroup %d, got EOF", GroupTag::Id);

                field.reserve(instances);

                GroupSet groupSet;

                int tag;
                bool inGroup = true;

                do
                {
                    typename Field::GroupType groupRef;

                    for (;;)
                    {

                        StreamCursor::Revert revertTag(cursor);
                        TRY_MATCH_INT(
                            tag,
                            "Could not parse tag in RepeatingGroup %d, expected int, got '%c'",
                            GroupTag::Id, CURSOR_CURRENT(cursor)
                        );

                        // The tag we just encountered is invalid for the RepeatingGroup
                        if (!groupSet.valid(tag))
                        {
                            // If it's not valid for the Message either, we consider it to be
                            // a custom tag
                            if (!tagSet.valid(tag) && tag != 10)
                            {
                                revertTag.ignore();
                                TRY_ADVANCE("Expected value after tag %d, got EOF", tag);

                                StreamCursor::Token valueToken(cursor);
                                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", tag);

                                if (!strict)
                                {
                                    if (!skipUnknown)
                                        groupRef.unparsed.emplace_back(tag, valueToken.view());
                                    TRY_ADVANCE("Got early EOF after tag %d value", tag);
                                    continue;
                                }
                                else if (strict)
                                {
                                    context.setError(ErrorKind::UnknownTag, "Encountered unknown tag %d in RepeatingGroup %d", tag, GroupTag::Id);
                                    return;
                                }
                            }

                            inGroup = false;
                            break;
                        }

                        // The tag is already set in our GroupSet, we finished parsing the current instance
                        if (groupSet.test(tag))
                            break;

                        revertTag.ignore();

                        // Literal('=')
                        TRY_ADVANCE("Expected value after Tag %d, got EOF", tag);

                        groupSet.set(tag);

                        Visitor visitor(context, groupSet, strict, skipUnknown);

                        // Invariant: here visitField should ALWAYS return true as we are checking if the tag
                        // is valid prior to the call
                        //
                        // TODO: enfore the invariant ?
                        visitField(groupRef, tag, visitor);

                        // If we are in a recursive RepeatingGroup parsing, we must *NOT* advance the cursor
                        if (!visitor.recursive)
                            TRY_ADVANCE("Got early EOF in RepeatingGroup %d", GroupTag::Id);
                    }

                    field.add(std::move(groupRef));
                    groupSet.reset();

                } while (inGroup);

            }